

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ieee.cc
# Opt level: O0

void TestSingle_IsDenormal(void)

{
  char *unaff_retaddr;
  uint32_t bits;
  uint32_t min_float32;
  undefined1 in_stack_ffffffffffffffef;
  Single in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  undefined4 uVar1;
  Single local_8;
  int line;
  
  line = 1;
  double_conversion::Single::Single(&local_8,1);
  double_conversion::Single::IsDenormal
            ((Single *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0.d32_));
  CheckHelper(unaff_retaddr,line,
              (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0.d32_),
              (bool)in_stack_ffffffffffffffef);
  uVar1 = 0x7fffff;
  double_conversion::Single::Single((Single *)&stack0xfffffffffffffff0,0x7fffff);
  double_conversion::Single::IsDenormal((Single *)CONCAT44(uVar1,in_stack_fffffffffffffff0.d32_));
  CheckHelper(unaff_retaddr,line,(char *)CONCAT44(uVar1,in_stack_fffffffffffffff0.d32_),
              (bool)in_stack_ffffffffffffffef);
  uVar1 = 0x800000;
  double_conversion::Single::Single((Single *)&stack0xffffffffffffffec,0x800000);
  double_conversion::Single::IsDenormal((Single *)CONCAT44(uVar1,in_stack_fffffffffffffff0.d32_));
  CheckHelper(unaff_retaddr,line,(char *)CONCAT44(uVar1,in_stack_fffffffffffffff0.d32_),
              (bool)in_stack_ffffffffffffffef);
  return;
}

Assistant:

TEST(Single_IsDenormal) {
  uint32_t min_float32 = 0x00000001;
  CHECK(Single(min_float32).IsDenormal());
  uint32_t bits = 0x007FFFFF;
  CHECK(Single(bits).IsDenormal());
  bits = 0x00800000;
  CHECK(!Single(bits).IsDenormal());
}